

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

complex<long_double> * __thiscall
TPZSkylMatrix<std::complex<long_double>_>::GetVal
          (complex<long_double> *__return_storage_ptr__,
          TPZSkylMatrix<std::complex<long_double>_> *this,int64_t r,int64_t c)

{
  undefined8 *puVar1;
  complex<long_double> **ppcVar2;
  complex<long_double> *pcVar3;
  complex<long_double> *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int64_t col;
  int64_t row;
  long lVar8;
  longdouble lVar9;
  longdouble lVar10;
  
  ppcVar2 = (this->fElem).fStore;
  lVar8 = r - c;
  if (lVar8 == 0 || r < c) {
    lVar8 = c - r;
    if (lVar8 < (long)ppcVar2[c + 1] - (long)ppcVar2[c] >> 5) {
      pcVar4 = (this->fElem).fStore[c];
      pcVar3 = pcVar4 + lVar8;
      uVar5 = *(undefined8 *)pcVar3->_M_value;
      uVar6 = *(undefined8 *)(pcVar3->_M_value + 8);
      puVar1 = (undefined8 *)(pcVar4[lVar8]._M_value + 0x10);
      uVar7 = puVar1[1];
      *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) = *puVar1;
      *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar7;
      *(undefined8 *)__return_storage_ptr__->_M_value = uVar5;
      *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar6;
      return __return_storage_ptr__;
    }
  }
  else if (lVar8 < (long)ppcVar2[r + 1] - (long)ppcVar2[r] >> 5) {
    pcVar3 = (this->fElem).fStore[r];
    lVar9 = *(longdouble *)pcVar3[lVar8]._M_value;
    lVar10 = -*(longdouble *)(pcVar3[lVar8]._M_value + 0x10);
    goto LAB_00ccddc7;
  }
  lVar9 = (longdouble)0;
  lVar10 = lVar9;
LAB_00ccddc7:
  *(longdouble *)__return_storage_ptr__->_M_value = lVar9;
  *(longdouble *)(__return_storage_ptr__->_M_value + 0x10) = lVar10;
  return __return_storage_ptr__;
}

Assistant:

const TVar
TPZSkylMatrix<TVar>::GetVal(const int64_t r,const int64_t c ) const
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col ){
		this->Swap( &row, &col );
        const int64_t index   = col - row;
        if ( index < Size(col) ){
            if constexpr (is_complex<TVar>::value){
                return( std::conj(fElem[col][index]) );
            }else{
                return( fElem[col][index] );
            }
        }else{
            return (TVar)0;
        }
    }
	const int64_t index   = col - row;
	if ( index < Size(col) )
		return( fElem[col][index] );
	else {
		return (TVar) 0;
    }

}